

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

owner * store_ownerbyidx(store_conflict *s,uint idx)

{
  owner *poVar1;
  
  poVar1 = s->owners;
  while( true ) {
    if (poVar1 == (owner *)0x0) {
      quit_fmt("Bad call to store_ownerbyidx: idx is %d\n");
      return (owner *)0x0;
    }
    if (poVar1->oidx == idx) break;
    poVar1 = poVar1->next;
  }
  return poVar1;
}

Assistant:

struct owner *store_ownerbyidx(struct store *s, unsigned int idx) {
	struct owner *o;
	for (o = s->owners; o; o = o->next) {
		if (o->oidx == idx)
			return o;
	}

	quit_fmt("Bad call to store_ownerbyidx: idx is %d\n", idx);
	return 0; /* Needed to avoid Windows compiler warning */
}